

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_diag.cc
# Opt level: O2

void __thiscall
ipx::KKTSolverDiag::_Solve
          (KKTSolverDiag *this,Vector *a,Vector *b,double tol,Vector *x,Vector *y,Info *info)

{
  ipxint *piVar1;
  NormalMatrix *this_00;
  DiagonalPrecond *this_01;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Model *pMVar5;
  double *pdVar6;
  double *pdVar7;
  pointer piVar8;
  Info *pIVar9;
  Vector *lhs;
  Int IVar10;
  long lVar11;
  ulong uVar12;
  NormalMatrix *__timer;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar16;
  ConjugateResiduals cr;
  Vector rhs;
  ConjugateResiduals local_80;
  Vector *local_68;
  double local_60;
  Info *local_58;
  ulong local_50;
  Vector *local_48;
  valarray<double> local_40;
  
  pMVar5 = this->model_;
  uVar2 = pMVar5->num_rows_;
  uVar3 = pMVar5->num_cols_;
  local_80.control_ = (Control *)b;
  local_68 = b;
  local_60 = tol;
  local_58 = info;
  local_48 = y;
  std::valarray<double>::valarray<std::__detail::_UnClos<std::__negate,std::_ValArray,double>>
            (&local_40,
             (_Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> *)
             &local_80);
  uVar14 = 0;
  uVar12 = (ulong)(uVar3 + uVar2);
  local_50 = (ulong)uVar2;
  if ((int)(uVar3 + uVar2) < 1) {
    uVar12 = uVar14;
  }
  for (; lhs = local_48, uVar12 != uVar14; uVar14 = uVar14 + 1) {
    ScatterColumn(&pMVar5->AI_,(Int)uVar14,(this->W_)._M_data[uVar14] * a->_M_data[uVar14],&local_40
                 );
  }
  local_80.control_ = (Control *)0x0;
  std::valarray<double>::operator=(local_48,(double *)&local_80);
  this_00 = &this->normal_matrix_;
  NormalMatrix::reset_time(this_00);
  uVar12 = local_50;
  pIVar9 = local_58;
  this_01 = &this->precond_;
  DiagonalPrecond::reset_time(this_01);
  ConjugateResiduals::ConjugateResiduals(&local_80,this->control_);
  __timer = this_00;
  ConjugateResiduals::Solve
            (&local_80,&this_00->super_LinearOperator,&this_01->super_LinearOperator,&local_40,
             local_60,(this->resscale_)._M_data,this->maxiter_,lhs);
  IVar10 = ConjugateResiduals::errflag(&local_80);
  (pIVar9->super_ipx_info).errflag = IVar10;
  IVar10 = ConjugateResiduals::iter(&local_80);
  piVar1 = &(pIVar9->super_ipx_info).kktiter1;
  *piVar1 = *piVar1 + IVar10;
  ConjugateResiduals::time(&local_80,(time_t *)__timer);
  (pIVar9->super_ipx_info).time_cr1 = extraout_XMM0_Qa + (pIVar9->super_ipx_info).time_cr1;
  NormalMatrix::time(this_00,(time_t *)__timer);
  (pIVar9->super_ipx_info).time_cr1_AAt =
       extraout_XMM0_Qa_00 + (pIVar9->super_ipx_info).time_cr1_AAt;
  DiagonalPrecond::time(this_01,(time_t *)__timer);
  (pIVar9->super_ipx_info).time_cr1_pre =
       extraout_XMM0_Qa_01 + (pIVar9->super_ipx_info).time_cr1_pre;
  IVar10 = ConjugateResiduals::iter(&local_80);
  this->iter_ = this->iter_ + IVar10;
  uVar14 = 0;
  uVar15 = uVar12 & 0xffffffff;
  if ((int)uVar12 < 1) {
    uVar15 = 0;
  }
  pdVar6 = local_68->_M_data;
  pdVar7 = x->_M_data;
  for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    pdVar7[(long)(int)uVar3 + uVar14] = pdVar6[uVar14];
  }
  uVar12 = 0;
  uVar14 = 0;
  if (0 < (int)uVar3) {
    uVar14 = (ulong)uVar3;
  }
  for (; uVar12 != uVar14; uVar12 = uVar12 + 1) {
    dVar16 = DotColumn(&pMVar5->AI_,(Int)uVar12,lhs);
    pdVar6 = x->_M_data;
    pdVar6[uVar12] = (a->_M_data[uVar12] - dVar16) * (this->W_)._M_data[uVar12];
    piVar8 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = piVar8[uVar12 + 1];
    for (lVar11 = (long)piVar8[uVar12]; lVar11 < iVar4; lVar11 = lVar11 + 1) {
      lVar13 = (long)(pMVar5->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11] + (long)(int)uVar3;
      pdVar6[lVar13] =
           pdVar6[lVar13] -
           pdVar6[uVar12] *
           (pMVar5->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    }
  }
  operator_delete(local_40._M_data);
  return;
}

Assistant:

void KKTSolverDiag::_Solve(const Vector& a, const Vector& b, double tol,
                            Vector& x, Vector& y, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(factorized_);

    // Compose right-hand side AI*W*a-b.
    Vector rhs = -b;
    for (Int j = 0; j < n+m; j++)
        ScatterColumn(AI, j, W_[j]*a[j], rhs);

    // Solve normal equations.
    y = 0.0;
    normal_matrix_.reset_time();
    precond_.reset_time();
    ConjugateResiduals cr(control_);
    cr.Solve(normal_matrix_, precond_, rhs, tol, &resscale_[0], maxiter_, y);
    info->errflag = cr.errflag();
    info->kktiter1 += cr.iter();
    info->time_cr1 += cr.time();
    info->time_cr1_AAt += normal_matrix_.time();
    info->time_cr1_pre += precond_.time();
    iter_ += cr.iter();

    // Recover solution to KKT system.
    for (Int i = 0; i < m; i++)
        x[n+i] = b[i];
    for (Int j = 0; j < n; j++) {
        double aty = DotColumn(AI, j, y);
        x[j] = W_[j] * (a[j]-aty);
        for (Int p = AI.begin(j); p < AI.end(j); p++) {
            Int i = AI.index(p);
            x[n+i] -= x[j] * AI.value(p);
        }
    }
}